

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlAttribute
               (ostream *stream,string *element_name,string *name,string *value)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  ostream *poVar2;
  string local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  GetReservedAttributesForElement(&local_40,element_name);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_40.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_40.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,name);
  if (_Var1._M_current ==
      local_40.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GTestLog::GTestLog((GTestLog *)&local_60,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/googletest/src/gtest.cc"
                       ,0xcca);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition std::find(allowed_names.begin(), allowed_names.end(), name) != allowed_names.end() failed. "
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Attribute ",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is not allowed for element <",0x1d);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(element_name->_M_dataplus)._M_p,element_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">.",2);
    GTestLog::~GTestLog((GTestLog *)&local_60);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
  EscapeXml(&local_60,value,true);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlAttribute(
    std::ostream* stream,
    const std::string& element_name,
    const std::string& name,
    const std::string& value) {
  const std::vector<std::string>& allowed_names =
      GetReservedAttributesForElement(element_name);

  GTEST_CHECK_(std::find(allowed_names.begin(), allowed_names.end(), name) !=
                   allowed_names.end())
      << "Attribute " << name << " is not allowed for element <" << element_name
      << ">.";

  *stream << " " << name << "=\"" << EscapeXmlAttribute(value) << "\"";
}